

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdirentryinfo_p.h
# Opt level: O0

void __thiscall QDirEntryInfo::~QDirEntryInfo(QDirEntryInfo *this)

{
  QFileSystemEntry *in_RDI;
  
  std::optional<QFileInfo>::~optional((optional<QFileInfo> *)0x297000);
  QFileSystemEntry::~QFileSystemEntry(in_RDI);
  return;
}

Assistant:

const QFileSystemMetaData &ensureFilled(QFileSystemMetaData::MetaDataFlags what)
    {
        if (!metaData.hasFlags(what))
            QFileSystemEngine::fillMetaData(entry, metaData, what);
        return metaData;
    }